

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O0

void free_atom_server(atom_server as)

{
  void *in_RDI;
  send_get_atom_msg_ptr stored;
  Tcl_HashEntry *entry;
  Tcl_HashSearch search;
  Tcl_HashSearch *in_stack_ffffffffffffffc8;
  Tcl_HashTable *in_stack_ffffffffffffffd0;
  undefined8 *__ptr;
  Tcl_HashEntry *local_28;
  Tcl_HashTable *in_stack_ffffffffffffffe0;
  
  local_28 = Tcl_FirstHashEntry(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  while (local_28 != (Tcl_HashEntry *)0x0) {
    __ptr = (undefined8 *)local_28->clientData;
    free((void *)*__ptr);
    free(__ptr);
    local_28 = Tcl_NextHashEntry((Tcl_HashSearch *)&stack0xffffffffffffffe0);
  }
  Tcl_DeleteHashTable(in_stack_ffffffffffffffe0);
  Tcl_DeleteHashTable(in_stack_ffffffffffffffe0);
  free(in_RDI);
  return;
}

Assistant:

void
free_atom_server(atom_server as)
{
  Tcl_HashSearch search;
  Tcl_HashEntry * entry = Tcl_FirstHashEntry(&as->string_hash_table, &search);
  while (entry) {
    send_get_atom_msg_ptr stored;
    stored = (send_get_atom_msg_ptr) Tcl_GetHashValue(entry);
    free(stored->atom_string);
    free(stored);
    entry = Tcl_NextHashEntry(&search);
  }
  Tcl_DeleteHashTable(&as->string_hash_table);
  Tcl_DeleteHashTable(&as->value_hash_table);
  free(as);
}